

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O3

void __thiscall swrenderer::PalWall1Command::PalWall1Command(PalWall1Command *this)

{
  int iVar1;
  uint8_t *puVar2;
  
  puVar2 = drawerargs::dc_dest;
  iVar1 = drawerargs::dc_pitch;
  (this->super_DrawerCommand)._dest_y =
       (int)(((long)drawerargs::dc_dest - drawerargs::dc_destorg) / (long)drawerargs::dc_pitch);
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006eabd8;
  *(undefined4 *)&(this->super_DrawerCommand).field_0xc = drawerargs::dc_iscale;
  this->_texturefrac = drawerargs::dc_texturefrac;
  this->_colormap = drawerargs::dc_colormap;
  this->_count = drawerargs::dc_count;
  this->_source = drawerargs::dc_source;
  this->_dest = puVar2;
  this->_fracbits = drawerargs::dc_wall_fracbits;
  this->_pitch = iVar1;
  this->_srcblend = drawerargs::dc_srcblend;
  this->_destblend = drawerargs::dc_destblend;
  return;
}

Assistant:

DrawerCommand()
	{
		_dest_y = static_cast<int>((swrenderer::drawerargs::dc_dest - swrenderer::drawerargs::dc_destorg) / (swrenderer::drawerargs::dc_pitch));
	}